

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend(TPZGeoBlend<pzgeom::TPZGeoPoint> *this)

{
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0] = -1;
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b66c0;
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_018a3510;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x30);
  return;
}

Assistant:

TPZSavable() : TPZRegisterClassId(&TPZSavable::ClassId) { }